

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hebrwcal.cpp
# Opt level: O0

void __thiscall
icu_63::HebrewCalendar::validateField
          (HebrewCalendar *this,UCalendarDateFields field,UErrorCode *status)

{
  UBool UVar1;
  int year;
  int32_t iVar2;
  UErrorCode *status_local;
  UCalendarDateFields field_local;
  HebrewCalendar *this_local;
  
  if (field == UCAL_MONTH) {
    year = (*(this->super_Calendar).super_UObject._vptr_UObject[0x24])();
    UVar1 = isLeapYear(year);
    if ((UVar1 == '\0') &&
       (iVar2 = Calendar::internalGet(&this->super_Calendar,UCAL_MONTH), iVar2 == 5)) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      return;
    }
  }
  Calendar::validateField(&this->super_Calendar,field,status);
  return;
}

Assistant:

void HebrewCalendar::validateField(UCalendarDateFields field, UErrorCode &status) {
    if (field == UCAL_MONTH && !isLeapYear(handleGetExtendedYear()) && internalGet(UCAL_MONTH) == ADAR_1) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    Calendar::validateField(field, status);
}